

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::objectivec::anon_unknown_7::FieldOrderingByStorageSize::operator()
          (FieldOrderingByStorageSize *this,FieldDescriptor *a,FieldDescriptor *b)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  
  uVar1 = OrderGroupForFieldDescriptor((FieldDescriptor *)this);
  uVar2 = OrderGroupForFieldDescriptor(a);
  bVar3 = uVar1 < uVar2;
  if (uVar1 == uVar2) {
    bVar3 = *(int *)(this + 0x38) < *(int *)(a + 0x38);
  }
  return bVar3;
}

Assistant:

inline bool operator()(const FieldDescriptor* a,
                         const FieldDescriptor* b) const {
    // Order by grouping.
    const int order_group_a = OrderGroupForFieldDescriptor(a);
    const int order_group_b = OrderGroupForFieldDescriptor(b);
    if (order_group_a != order_group_b) {
      return order_group_a < order_group_b;
    }
    // Within the group, order by field number (provides stable ordering).
    return a->number() < b->number();
  }